

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryPipelineBarrierTests.cpp
# Opt level: O0

int __thiscall
vkt::memory::anon_unknown_0::CreateImage::verify
          (CreateImage *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,size_t tbslen)

{
  int extraout_EAX;
  TextureLevel *this_00;
  TextureFormat local_50;
  TextureLevel local_48;
  uchar *local_20;
  size_t param_2_local;
  VerifyContext *context_local;
  CreateImage *this_local;
  
  local_20 = sig;
  param_2_local = (size_t)ctx;
  context_local = (VerifyContext *)this;
  tcu::TextureFormat::TextureFormat(&local_50,RGBA,UNORM_INT8);
  tcu::TextureLevel::TextureLevel(&local_48,&local_50,this->m_imageWidth,this->m_imageHeight,1);
  this_00 = VerifyContext::getReferenceImage((VerifyContext *)param_2_local);
  tcu::TextureLevel::operator=(this_00,&local_48);
  tcu::TextureLevel::~TextureLevel(&local_48);
  return extraout_EAX;
}

Assistant:

void CreateImage::verify (VerifyContext& context, size_t)
{
	context.getReferenceImage() = TextureLevel(TextureFormat(TextureFormat::RGBA, TextureFormat::UNORM_INT8), m_imageWidth, m_imageHeight);
}